

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

void zap_dig(schar dx,schar dy,schar dz)

{
  undefined1 *puVar1;
  byte bVar2;
  char cVar3;
  permonst *ppVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  monst *mon;
  level *plVar8;
  boolean bVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  obj *obj;
  xchar y;
  uint x;
  uint uVar14;
  char *pcVar15;
  xchar x_00;
  int iVar16;
  int iVar17;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  mon = u.ustuck;
  if ((u._1052_1_ & 1) == 0) {
    if (dz == '\0') {
      iVar11 = 0x1000000;
      if (((level->flags).field_0xa & 2) != 0) {
        bVar9 = on_level(&u.uz,&dungeon_topology.d_earth_level);
        iVar11 = (uint)(bVar9 != '\0') << 0x18;
      }
      x = (uint)u.ux;
      uVar14 = (uint)u.uy;
      uVar12 = mt_random();
      tmp_at(-1,0x40001);
      iVar16 = uVar12 % 0x12 + 7;
      bVar6 = false;
      bVar7 = false;
      iVar5 = uVar12 % 0x12 + 8;
      do {
        plVar8 = level;
        x = x + (int)dx;
        uVar12 = uVar14 + (int)dy;
        if ((0x4e < x - 1) || (0x14 < uVar12)) break;
        tmp_at(x,uVar12);
        (*windowprocs.win_delay)();
        uVar14 = uVar12;
        bVar9 = closed_door(level,x,uVar12);
        x_00 = (xchar)x;
        y = (xchar)uVar14;
        if ((bVar9 == '\0') && (bVar2 = plVar8->locations[x][uVar12].typ, bVar2 != 0xf)) {
          iVar17 = iVar16;
          if ((char)((uint)iVar11 >> 0x18) == '\0') {
            if ((char)bVar2 < '\r' && bVar2 != 0) {
              if ((plVar8->locations[x][uVar12].field_0x6 & 0x80) == 0) {
                pcVar15 = in_rooms(level,x_00,y,0x12);
                if (*pcVar15 != '\0') {
                  add_damage(x_00,y,200);
                  bVar6 = true;
                }
                plVar8->locations[x][uVar12].typ = '\x19';
                unblock_point(x,uVar14);
                iVar17 = iVar5 + -3;
              }
              else if (((u.uprops[0x1e].intrinsic == 0) &&
                       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                      ((iVar17 = 0, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                pcVar15 = "The wall glows then fades.";
LAB_00166df7:
                pline(pcVar15);
                iVar17 = 0;
              }
            }
            else if ((bVar2 == 0xd) ||
                    ((bVar2 == 0 && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0)))) {
              if ((plVar8->locations[x][uVar12].field_0x6 & 0x80) == 0) {
                plVar8->locations[x][uVar12].typ = '\x19';
LAB_00166cb0:
                unblock_point(x,uVar14);
                iVar17 = iVar5 + -3;
              }
              else if (((u.uprops[0x1e].intrinsic == 0) &&
                       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                      ((iVar17 = 0, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                pcVar15 = "The tree shudders but is unharmed.";
                goto LAB_00166df7;
              }
            }
            else if ((bVar2 & 0xef) == 0) {
              if ((plVar8->locations[x][uVar12].field_0x6 & 0x80) == 0) {
                plVar8->locations[x][uVar12].typ = '\x18';
                goto LAB_00166cb0;
              }
              if ((((u.uprops[0x1e].intrinsic == 0) &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 ((iVar17 = 0, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                pcVar15 = "The rock glows then fades.";
                goto LAB_00166df7;
              }
            }
          }
          else if ((char)bVar2 < '\x11') {
            bVar9 = may_dig(level,x_00,y);
            if (bVar9 == '\0') break;
            cVar3 = plVar8->locations[x][uVar12].typ;
            if (cVar3 == '\0' || '\f' < cVar3) {
              if (cVar3 == '\r') {
LAB_00166dae:
                plVar8->locations[x][uVar12].typ = '\x19';
                iVar16 = -3;
              }
              else {
                if (cVar3 == '\x0f') goto LAB_00166b7f;
                if ((cVar3 == '\0') && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0))
                goto LAB_00166dae;
                plVar8->locations[x][uVar12].typ = '\x18';
                iVar16 = -2;
              }
            }
            else {
LAB_00166b7f:
              pcVar15 = in_rooms(level,x_00,y,0x12);
              if (*pcVar15 != '\0') {
                add_damage(x_00,y,200);
                bVar6 = true;
              }
              watch_dig((monst *)0x0,x_00,y,'\x01');
              if ((((level->flags).field_0xa & 8) == 0) ||
                 (bVar9 = in_town(x,uVar14), bVar9 != '\0')) {
                plVar8->locations[x][uVar12].typ = '\x17';
                puVar1 = &plVar8->locations[x][uVar12].field_0x6;
                *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
              }
              else {
                plVar8->locations[x][uVar12].typ = '\x18';
              }
              iVar16 = -3;
            }
            unblock_point(x,uVar14);
            iVar17 = iVar5 + iVar16;
          }
        }
        else {
          iVar16 = artifact_door(level,x,uVar14);
          if (iVar16 != 0) {
            if ((viz_array[uVar12][x] & 2U) != 0) {
              pline("The door glows then fades.");
            }
            break;
          }
          pcVar15 = in_rooms(level,x_00,y,0x12);
          if (*pcVar15 != '\0') {
            add_damage(x_00,y,400);
            bVar7 = true;
          }
          if (plVar8->locations[x][uVar12].typ == '\x0f') {
            plVar8->locations[x][uVar12].typ = '\x17';
          }
          else if ((viz_array[uVar12][x] & 2U) != 0) {
            pline("The door is razed!");
          }
          watch_dig((monst *)0x0,x_00,y,'\x01');
          puVar1 = &plVar8->locations[x][uVar12].field_0x6;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
          unblock_point(x,uVar14);
          iVar17 = iVar5 + -3;
        }
        iVar16 = iVar17 + -1;
        iVar5 = iVar17;
      } while (0 < iVar17);
      tmp_at(-6,0);
      if (bVar6 || bVar7) {
        pcVar15 = "dig into";
        if (bVar7) {
          pcVar15 = "destroy";
        }
        pay_for_damage(pcVar15,'\0');
        return;
      }
    }
    else {
      bVar9 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar9 == '\0') &&
          (bVar9 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar9 == '\0')) &&
         ((u._1052_1_ & 2) == 0)) {
        if ((-1 < dz) && (bVar9 = On_stairs(u.ux,u.uy), bVar9 == '\0')) {
          watch_dig((monst *)0x0,u.ux,u.uy,'\x01');
          dighole('\0');
          return;
        }
        bVar9 = On_stairs(u.ux,u.uy);
        if (bVar9 != '\0') {
          if (u.ux == (level->dnladder).sx) {
            pcVar15 = "ladder";
          }
          else {
            pcVar15 = "stairs";
            if (u.ux == (level->upladder).sx) {
              pcVar15 = "ladder";
            }
          }
          pcVar13 = ceiling((int)u.ux,(int)u.uy);
          pline("The beam bounces off the %s and hits the %s.",pcVar15,pcVar13);
        }
        pcVar15 = ceiling((int)u.ux,(int)u.uy);
        pline("You loosen a rock from the %s.",pcVar15);
        pcVar15 = body_part(8);
        pline("It falls on your %s!",pcVar15);
        uVar14 = 6;
        if ((uarmh != (obj *)0x0) &&
           (uVar10 = *(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f, 10 < uVar10)) {
          uVar14 = (uint)(0x11 < uVar10) * 4 + 2;
        }
        uVar12 = mt_random();
        losehp(uVar12 % uVar14 + 1,"falling rock",0);
        obj = mksobj_at(0x213,level,(int)u.ux,(int)u.uy,'\0','\0');
        if (obj != (obj *)0x0) {
          xname(obj);
          stackobj((obj *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        }
        newsym((int)u.ux,(int)u.uy);
        return;
      }
    }
  }
  else {
    ppVar4 = (u.ustuck)->data;
    if (ppVar4 != mons + 0x9f && ppVar4->mlet != '\x16') {
      if ((ppVar4->mflags1 & 0x40000) != 0) {
        pcVar15 = mon_nam(u.ustuck);
        pcVar15 = s_suffix(pcVar15);
        pcVar13 = mbodypart(mon,0x12);
        pline("You pierce %s %s wall!",pcVar15,pcVar13);
      }
      ppVar4 = mon->data;
      iVar11 = 1;
      if (ppVar4 == mons + 0x13b) {
        iVar11 = (mon->mhp - (mon->mhp + 1 >> 0x1f)) + 1 >> 1;
      }
      mon->mhp = iVar11;
      expels(mon,ppVar4,(ppVar4->mflags1 >> 0x12 & 1) == 0);
      return;
    }
  }
  return;
}

Assistant:

void zap_dig(schar dx, schar dy, schar dz)
{
	struct rm *room;
	struct monst *mtmp;
	struct obj *otmp;
	int zx, zy, digdepth;
	boolean shopdoor, shopwall, maze_dig;

	if (u.uswallow) {
	    mtmp = u.ustuck;

	    if (!is_whirly(mtmp->data)) {
		if (is_animal(mtmp->data))
		    pline("You pierce %s %s wall!",
			s_suffix(mon_nam(mtmp)), mbodypart(mtmp, STOMACH));

		/* Juiblex takes less damage from a wand of digging. */
		if (mtmp->data == &mons[PM_JUIBLEX])
		    mtmp->mhp = (mtmp->mhp + 1) / 2;
		else
		    mtmp->mhp = 1;		/* almost dead */

		expels(mtmp, mtmp->data, !is_animal(mtmp->data));
	    }
	    return;
	} /* swallowed */

	if (dz) {
	    if (!Is_airlevel(&u.uz) && !Is_waterlevel(&u.uz) && !Underwater) {
		if (dz < 0 || On_stairs(u.ux, u.uy)) {
		    if (On_stairs(u.ux, u.uy))
			pline("The beam bounces off the %s and hits the %s.",
			      (u.ux == level->dnladder.sx || u.ux == level->upladder.sx) ?
			      "ladder" : "stairs", ceiling(u.ux, u.uy));
		    pline("You loosen a rock from the %s.", ceiling(u.ux, u.uy));
		    pline("It falls on your %s!", body_part(HEAD));
		    losehp(rnd((uarmh && is_metallic(uarmh)) ? 2 : 6),
			   "falling rock", KILLED_BY_AN);
		    otmp = mksobj_at(ROCK, level, u.ux, u.uy, FALSE, FALSE);
		    if (otmp) {
			xname(otmp);	/* set dknown, maybe bknown */
			stackobj(otmp);
		    }
		    newsym(u.ux, u.uy);
		} else {
		    watch_dig(NULL, u.ux, u.uy, TRUE);
		    dighole(FALSE);
		}
	    }
	    return;
	} /* up or down */

	/* normal case: digging across the level */
	shopdoor = shopwall = FALSE;
	maze_dig = level->flags.is_maze_lev && !Is_earthlevel(&u.uz);
	zx = u.ux + dx;
	zy = u.uy + dy;
	digdepth = rn1(18, 8);
	tmp_at(DISP_BEAM, dbuf_effect(E_MISC, E_digbeam));
	while (--digdepth >= 0) {
	    if (!isok(zx,zy)) break;
	    room = &level->locations[zx][zy];
	    tmp_at(zx,zy);
	    win_delay_output();	/* wait a little bit */
	    if (closed_door(level, zx, zy) || room->typ == SDOOR) {
		/* ALI - Artifact doors */
		if (artifact_door(level, zx, zy)) {
		    if (cansee(zx, zy))
			pline("The door glows then fades.");
		    break;
		}
		if (*in_rooms(level, zx,zy,SHOPBASE)) {
		    add_damage(zx, zy, 400L);
		    shopdoor = TRUE;
		}
		if (room->typ == SDOOR)
		    room->typ = DOOR;
		else if (cansee(zx, zy))
		    pline("The door is razed!");
		watch_dig(NULL, zx, zy, TRUE);
		room->doormask = D_NODOOR;
		unblock_point(zx,zy); /* vision */
		digdepth -= 2;
	    } else if (maze_dig) {
		if (IS_WALL(room->typ)) {
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			if (*in_rooms(level, zx,zy,SHOPBASE)) {
			    add_damage(zx, zy, 200L);
			    shopwall = TRUE;
			}
			room->typ = ROOM;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The wall glows then fades.");
			digdepth = 0;
		    }
		} else if (IS_TREE(level, room->typ)) { /* check trees before stone */
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			room->typ = ROOM;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The tree shudders but is unharmed.");
			digdepth = 0;
		    }
		} else if (room->typ == STONE || room->typ == SCORR) {
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			room->typ = CORR;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The rock glows then fades.");
			digdepth = 0;
		    }
		}
	    } else if (IS_ROCK(room->typ)) {
		if (!may_dig(level, zx,zy)) break;
		if (IS_WALL(room->typ) || room->typ == SDOOR) {
		    if (*in_rooms(level, zx,zy,SHOPBASE)) {
			add_damage(zx, zy, 200L);
			shopwall = TRUE;
		    }
		    watch_dig(NULL, zx, zy, TRUE);
		    if (level->flags.is_cavernous_lev && !in_town(zx, zy)) {
			room->typ = CORR;
		    } else {
			room->typ = DOOR;
			room->doormask = D_NODOOR;
		    }
		    digdepth -= 2;
		} else if (IS_TREE(level, room->typ)) {
		    room->typ = ROOM;
		    digdepth -= 2;
		} else {	/* IS_ROCK but not IS_WALL or SDOOR */
		    room->typ = CORR;
		    digdepth--;
		}
		unblock_point(zx,zy); /* vision */
	    }
	    zx += dx;
	    zy += dy;
	} /* while */
	
	tmp_at(DISP_END, 0);	/* closing call */
	if (shopdoor || shopwall)
	    pay_for_damage(shopdoor ? "destroy" : "dig into", FALSE);
	return;
}